

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlCtxtReadFile(xmlParserCtxtPtr ctxt,char *filename,char *encoding,int options)

{
  xmlParserInputPtr value;
  xmlParserInputPtr stream;
  int options_local;
  char *encoding_local;
  char *filename_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (filename == (char *)0x0) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    xmlInitParser();
    xmlCtxtReset(ctxt);
    value = xmlLoadExternalEntity(filename,(char *)0x0,ctxt);
    if (value == (xmlParserInputPtr)0x0) {
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      inputPush(ctxt,value);
      ctxt_local = (xmlParserCtxtPtr)xmlDoRead(ctxt,(char *)0x0,encoding,options,1);
    }
  }
  return (xmlDocPtr)ctxt_local;
}

Assistant:

xmlDocPtr
xmlCtxtReadFile(xmlParserCtxtPtr ctxt, const char *filename,
                const char *encoding, int options)
{
    xmlParserInputPtr stream;

    if (filename == NULL)
        return (NULL);
    if (ctxt == NULL)
        return (NULL);
    xmlInitParser();

    xmlCtxtReset(ctxt);

    stream = xmlLoadExternalEntity(filename, NULL, ctxt);
    if (stream == NULL) {
        return (NULL);
    }
    inputPush(ctxt, stream);
    return (xmlDoRead(ctxt, NULL, encoding, options, 1));
}